

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

int Cec_ManSatCheckNode(Cec_ManSat_t *p,Gia_Obj_t *pObj)

{
  Cec_ParSat_t *pCVar1;
  sat_solver *s;
  Gia_Obj_t *pGVar2;
  ABC_INT64_T AVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  int iVar8;
  int Lit;
  timespec ts;
  uint local_44;
  timespec local_40;
  
  pGVar7 = p->pAig->pObjs;
  iVar6 = 1;
  if (pGVar7 != pObj) {
    if ((Gia_Obj_t *)((ulong)pGVar7 ^ 1) == pObj) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                    ,0x1e1,"int Cec_ManSatCheckNode(Cec_ManSat_t *, Gia_Obj_t *)");
    }
    pCVar1 = p->pPars;
    iVar5 = pCVar1->nBTLimit;
    iVar4 = p->nCallsSince;
    p->nCallsSince = iVar4 + 1;
    p->nSatTotal = p->nSatTotal + 1;
    pGVar7 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
    if ((p->pSat == (sat_solver *)0x0) ||
       (((pCVar1->nSatVarMax != 0 && (pCVar1->nSatVarMax < p->nSatVars)) &&
        (pCVar1->nCallsRecycle <= iVar4)))) {
      Cec_ManSatSolverRecycle(p);
    }
    clock_gettime(3,&local_40);
    Cec_CnfNodeAddToSolver(p,pGVar7);
    clock_gettime(3,&local_40);
    s = p->pSat;
    if (s->qtail != s->qhead) {
      iVar4 = sat_solver_simplify(s);
      if (iVar4 == 0) {
        __assert_fail("status != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                      ,0x1fd,"int Cec_ManSatCheckNode(Cec_ManSat_t *, Gia_Obj_t *)");
      }
      if (p->pSat->qtail != p->pSat->qhead) {
        __assert_fail("p->pSat->qtail == p->pSat->qhead",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                      ,0x1fe,"int Cec_ManSatCheckNode(Cec_ManSat_t *, Gia_Obj_t *)");
      }
    }
    pGVar2 = p->pAig->pObjs;
    if ((pGVar7 < pGVar2) || (pGVar2 + p->pAig->nObjs <= pGVar7)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    local_44 = ((uint)pObj & 1) +
               p->pSatVars[(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555] * 2;
    if ((p->pPars->fPolarFlip != 0) && (*(long *)pGVar7 < 0)) {
      local_44 = local_44 ^ 1;
    }
    iVar4 = clock_gettime(3,&local_40);
    if (iVar4 < 0) {
      iVar4 = -1;
    }
    else {
      iVar4 = (int)(local_40.tv_nsec / 1000) + (int)local_40.tv_sec * 1000000;
    }
    AVar3 = (p->pSat->stats).conflicts;
    clock_gettime(3,&local_40);
    iVar5 = sat_solver_solve(p->pSat,(lit *)&local_44,(lit *)&local_40,(long)iVar5,0,0,0);
    iVar8 = (int)AVar3;
    if (iVar5 == 1) {
      iVar6 = clock_gettime(3,&local_40);
      if (iVar6 < 0) {
        iVar6 = -1;
      }
      else {
        iVar6 = (int)(local_40.tv_nsec / 1000) + (int)local_40.tv_sec * 1000000;
      }
      p->timeSatSat = p->timeSatSat + (iVar6 - iVar4);
      p->nSatSat = p->nSatSat + 1;
      p->nConfSat = p->nConfSat + ((int)(p->pSat->stats).conflicts - iVar8);
      iVar6 = 0;
    }
    else if (iVar5 == -1) {
      iVar5 = clock_gettime(3,&local_40);
      if (iVar5 < 0) {
        iVar5 = -1;
      }
      else {
        iVar5 = (int)(local_40.tv_nsec / 1000) + (int)local_40.tv_sec * 1000000;
      }
      p->timeSatUnsat = p->timeSatUnsat + (iVar5 - iVar4);
      local_44 = local_44 ^ 1;
      iVar5 = sat_solver_addclause(p->pSat,(lit *)&local_44,(lit *)&local_40);
      if (iVar5 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                      ,0x216,"int Cec_ManSatCheckNode(Cec_ManSat_t *, Gia_Obj_t *)");
      }
      p->nSatUnsat = p->nSatUnsat + 1;
      p->nConfUnsat = p->nConfUnsat + ((int)(p->pSat->stats).conflicts - iVar8);
    }
    else {
      iVar6 = clock_gettime(3,&local_40);
      if (iVar6 < 0) {
        iVar6 = -1;
      }
      else {
        iVar6 = (int)(local_40.tv_nsec / 1000) + (int)local_40.tv_sec * 1000000;
      }
      p->timeSatUndec = p->timeSatUndec + (iVar6 - iVar4);
      p->nSatUndec = p->nSatUndec + 1;
      p->nConfUndec = p->nConfUndec + ((int)(p->pSat->stats).conflicts - iVar8);
      iVar6 = -1;
    }
  }
  return iVar6;
}

Assistant:

int Cec_ManSatCheckNode( Cec_ManSat_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pObjR = Gia_Regular(pObj);
    int nBTLimit = p->pPars->nBTLimit;
    int Lit, RetValue, status, nConflicts;
    abctime clk, clk2;

    if ( pObj == Gia_ManConst0(p->pAig) )
        return 1;
    if ( pObj == Gia_ManConst1(p->pAig) )
    {
        assert( 0 );
        return 0;
    }

    p->nCallsSince++;  // experiment with this!!!
    p->nSatTotal++;
    
    // check if SAT solver needs recycling
    if ( p->pSat == NULL || 
        (p->pPars->nSatVarMax && 
         p->nSatVars > p->pPars->nSatVarMax && 
         p->nCallsSince > p->pPars->nCallsRecycle) )
        Cec_ManSatSolverRecycle( p );

    // if the nodes do not have SAT variables, allocate them
clk2 = Abc_Clock();
    Cec_CnfNodeAddToSolver( p, pObjR );
//ABC_PRT( "cnf", Abc_Clock() - clk2 );
//Abc_Print( 1, "%d \n", p->pSat->size );

clk2 = Abc_Clock();
//    Cec_SetActivityFactors( p, pObjR ); 
//ABC_PRT( "act", Abc_Clock() - clk2 );

    // propage unit clauses
    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
    Lit = toLitCond( Cec_ObjSatNum(p,pObjR), Gia_IsComplement(pObj) );
    if ( p->pPars->fPolarFlip )
    {
        if ( pObjR->fPhase )  Lit = lit_neg( Lit );
    }
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
clk = Abc_Clock();
    nConflicts = p->pSat->stats.conflicts;

clk2 = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, &Lit, &Lit + 1, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//ABC_PRT( "sat", Abc_Clock() - clk2 );

    if ( RetValue == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        Lit = lit_neg( Lit );
        RetValue = sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
        assert( RetValue );
        p->nSatUnsat++;
        p->nConfUnsat += p->pSat->stats.conflicts - nConflicts;       
//Abc_Print( 1, "UNSAT after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return 1;
    }
    else if ( RetValue == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nSatSat++;
        p->nConfSat += p->pSat->stats.conflicts - nConflicts;
//Abc_Print( 1, "SAT after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return 0;
    }
    else // if ( RetValue == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nSatUndec++;
        p->nConfUndec += p->pSat->stats.conflicts - nConflicts;
//Abc_Print( 1, "UNDEC after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return -1;
    }
}